

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Group.c
# Opt level: O0

int Llb_ManGroupHasVar(Llb_Man_t *p,int iGroup,int iVar)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  int local_34;
  int i;
  Aig_Obj_t *pObj;
  Llb_Grp_t *pGroup;
  int iVar_local;
  int iGroup_local;
  Llb_Man_t *p_local;
  
  pvVar2 = Vec_PtrEntry(p->vGroups,iGroup);
  for (local_34 = 0; iVar1 = Vec_PtrSize(*(Vec_Ptr_t **)((long)pvVar2 + 8)), local_34 < iVar1;
      local_34 = local_34 + 1) {
    pvVar3 = Vec_PtrEntry(*(Vec_Ptr_t **)((long)pvVar2 + 8),local_34);
    if (*(int *)((long)pvVar3 + 0x24) == iVar) {
      return 1;
    }
  }
  local_34 = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(*(Vec_Ptr_t **)((long)pvVar2 + 0x10));
    if (iVar1 <= local_34) {
      return 0;
    }
    pvVar3 = Vec_PtrEntry(*(Vec_Ptr_t **)((long)pvVar2 + 0x10),local_34);
    if (*(int *)((long)pvVar3 + 0x24) == iVar) break;
    local_34 = local_34 + 1;
  }
  return 1;
}

Assistant:

int Llb_ManGroupHasVar( Llb_Man_t * p, int iGroup, int iVar )
{
    Llb_Grp_t * pGroup = (Llb_Grp_t *)Vec_PtrEntry( p->vGroups, iGroup );
    Aig_Obj_t * pObj;
    int i;
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vIns, pObj, i )
        if ( pObj->Id == iVar )
            return 1;
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vOuts, pObj, i )
        if ( pObj->Id == iVar )
            return 1;
    return 0;
}